

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

Section * getSection(char *name,SectionType type,uint32_t org,SectionSpec *attrs,SectionModifier mod
                    )

{
  SectionType SVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  Section *pSVar5;
  FileStackNode *pFVar6;
  uint8_t *puVar7;
  int *piVar8;
  char *pcVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  char *fmt;
  code *pcVar13;
  ushort uVar14;
  byte bVar15;
  ulong uVar16;
  
  uVar10 = attrs->bank;
  bVar15 = attrs->alignment;
  uVar14 = attrs->alignOfs;
  uVar16 = (ulong)uVar14;
  if (uVar10 == 0xffffffff) {
    uVar10 = sectionTypeInfo[type].firstBank;
    if (sectionTypeInfo[type].lastBank != sectionTypeInfo[type].firstBank) {
      uVar10 = 0xffffffff;
    }
  }
  else if ((type & ~SECTTYPE_HRAM) - SECTTYPE_ROM0 < 0xfffffffe) {
    error("BANK only allowed for ROMX, WRAMX, SRAM, or VRAM sections\n");
  }
  else if (sectionTypeInfo[type].lastBank < uVar10 || uVar10 < sectionTypeInfo[type].firstBank) {
    error("%s bank value $%04x out of range ($%04x to $%04x)\n",sectionTypeInfo[type].name,
          (ulong)uVar10);
  }
  if (1 << (bVar15 & 0x1f) <= (int)(uint)uVar14) {
    uVar14 = 0;
    error("Alignment offset (%u) must be smaller than alignment size (%u)\n",uVar16);
  }
  if ((org != 0xffffffff) &&
     (((ushort)(sectionTypeInfo[type].size + sectionTypeInfo[type].startAddr) - 1 & 0xffff) < org ||
      org < sectionTypeInfo[type].startAddr)) {
    error("Section \"%s\"\'s fixed address $%04x is outside of range [$%04x; $%04x]\n",name,
          (ulong)org);
  }
  if (bVar15 == 0) {
LAB_00111687:
    bVar11 = 0;
  }
  else {
    if (0x10 < bVar15) {
      error("Alignment must be between 0 and 16, not %u\n",(ulong)bVar15);
      bVar15 = 0x10;
    }
    uVar12 = ~(-1 << (bVar15 & 0x1f));
    if (org == 0xffffffff) {
      if ((sectionTypeInfo[type].startAddr & uVar12) == 0) {
        bVar11 = bVar15;
        if (bVar15 == 0x10) {
          bVar11 = 0;
        }
        org = -(uint)(bVar15 != 0x10);
      }
      else {
        bVar11 = 0;
        error("Section \"%s\"\'s alignment cannot be attained in %s\n",name,
              sectionTypeInfo[type].name);
        org = 0;
      }
    }
    else {
      if ((org - uVar14 & uVar12) == 0) goto LAB_00111687;
      bVar11 = 0;
      error("Section \"%s\"\'s fixed address doesn\'t match its alignment\n",name);
    }
  }
  pSVar5 = sect_FindSectionByName(name);
  if (pSVar5 == (Section *)0x0) {
    pSVar5 = (Section *)malloc(0x48);
    if (pSVar5 != (Section *)0x0) {
      pcVar9 = strdup(name);
      pSVar5->name = pcVar9;
      if (pcVar9 == (char *)0x0) {
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        fmt = "Not enough memory for section name: %s\n";
        goto LAB_001118d6;
      }
      pSVar5->type = type;
      pSVar5->modifier = mod;
      pFVar6 = fstk_GetFileStack();
      pSVar5->src = pFVar6;
      uVar4 = lexer_GetLineNo();
      pSVar5->fileLine = uVar4;
      pSVar5->size = 0;
      pSVar5->org = org;
      pSVar5->bank = uVar10;
      pSVar5->align = bVar11;
      pSVar5->alignOfs = uVar14;
      pSVar5->next = (Section *)0x0;
      pSVar5->patches = (Patch *)0x0;
      bVar2 = sect_HasData(type);
      if (!bVar2) {
        pSVar5->data = (uint8_t *)0x0;
LAB_00111858:
        pSVar5->next = sectionList;
        sectionList = pSVar5;
        return pSVar5;
      }
      puVar7 = (uint8_t *)malloc((ulong)sectionTypeInfo[type].size);
      pSVar5->data = puVar7;
      if (puVar7 != (uint8_t *)0x0) goto LAB_00111858;
    }
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    fmt = "Not enough memory for section: %s\n";
LAB_001118d6:
    fatalerror(fmt,pcVar9);
  }
  SVar1 = pSVar5->type;
  if (SVar1 != type) {
    error("Section already exists but with type %s\n",sectionTypeInfo[SVar1].name);
  }
  uVar12 = (uint)(SVar1 != type);
  if (pSVar5->modifier == mod) {
    if (mod - SECTION_UNION < 2) {
      pcVar13 = mergeFragments;
      if (mod == SECTION_UNION) {
        pcVar13 = mergeSectUnion;
      }
      iVar3 = (*pcVar13)(pSVar5,type,org,bVar11,uVar14);
      uVar12 = iVar3 + uVar12;
      if (pSVar5->bank == 0xffffffff) {
        pSVar5->bank = uVar10;
      }
      else if (pSVar5->bank != uVar10 && uVar10 != 0xffffffff) {
        error("Section already declared with different bank %u\n");
        uVar12 = uVar12 + 1;
      }
    }
    else if (mod == SECTION_NORMAL) {
      error("Section already defined previously at ");
      fstk_Dump(pSVar5->src,pSVar5->fileLine);
      putc(10,_stderr);
      goto LAB_00111910;
    }
    if (uVar12 == 0) {
      return pSVar5;
    }
  }
  else {
    error("Section already declared as %s section\n",sectionModNames[pSVar5->modifier]);
LAB_00111910:
    uVar12 = uVar12 + 1;
  }
  pcVar9 = "s";
  if (uVar12 == 1) {
    pcVar9 = "";
  }
  fatalerror("Cannot create section \"%s\" (%u error%s)\n",pSVar5->name,(ulong)uVar12,pcVar9);
}

Assistant:

static struct Section *getSection(char const *name, enum SectionType type, uint32_t org,
				  struct SectionSpec const *attrs, enum SectionModifier mod)
{
	uint32_t bank = attrs->bank;
	uint8_t alignment = attrs->alignment;
	uint16_t alignOffset = attrs->alignOfs;

	// First, validate parameters, and normalize them if applicable

	if (bank != (uint32_t)-1) {
		if (type != SECTTYPE_ROMX && type != SECTTYPE_VRAM
		 && type != SECTTYPE_SRAM && type != SECTTYPE_WRAMX)
			error("BANK only allowed for ROMX, WRAMX, SRAM, or VRAM sections\n");
		else if (bank < sectionTypeInfo[type].firstBank || bank > sectionTypeInfo[type].lastBank)
			error("%s bank value $%04" PRIx32 " out of range ($%04" PRIx32 " to $%04"
				PRIx32 ")\n", sectionTypeInfo[type].name, bank,
				sectionTypeInfo[type].firstBank, sectionTypeInfo[type].lastBank);
	} else if (nbbanks(type) == 1) {
		// If the section type only has a single bank, implicitly force it
		bank = sectionTypeInfo[type].firstBank;
	}

	if (alignOffset >= 1 << alignment) {
		error("Alignment offset (%" PRIu16 ") must be smaller than alignment size (%u)\n",
		      alignOffset, 1U << alignment);
		alignOffset = 0;
	}

	if (org != (uint32_t)-1) {
		if (org < sectionTypeInfo[type].startAddr || org > endaddr(type))
			error("Section \"%s\"'s fixed address $%04" PRIx32
				" is outside of range [$%04" PRIx16 "; $%04" PRIx16 "]\n",
				name, org, sectionTypeInfo[type].startAddr, endaddr(type));
	}

	if (alignment != 0) {
		if (alignment > 16) {
			error("Alignment must be between 0 and 16, not %u\n", alignment);
			alignment = 16;
		}
		// It doesn't make sense to have both alignment and org set
		uint32_t mask = mask(alignment);

		if (org != (uint32_t)-1) {
			if ((org - alignOffset) & mask)
				error("Section \"%s\"'s fixed address doesn't match its alignment\n",
					name);
			alignment = 0; // Ignore it if it's satisfied
		} else if (sectionTypeInfo[type].startAddr & mask) {
			error("Section \"%s\"'s alignment cannot be attained in %s\n",
				name, sectionTypeInfo[type].name);
			alignment = 0; // Ignore it if it's unattainable
			org = 0;
		} else if (alignment == 16) {
			// Treat an alignment of 16 as being fixed at address 0
			alignment = 0;
			org = 0;
			// The address is known to be valid, since the alignment is
		}
	}

	// Check if another section exists with the same name; merge if yes, otherwise create one

	struct Section *sect = sect_FindSectionByName(name);

	if (sect) {
		mergeSections(sect, type, org, bank, alignment, alignOffset, mod);
	} else {
		sect = createSection(name, type, org, bank, alignment, alignOffset, mod);
		// Add the new section to the list (order doesn't matter)
		sect->next = sectionList;
		sectionList = sect;
	}

	return sect;
}